

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeBlocks.cpp
# Opt level: O0

bool wasm::optimizeBlock(Block *curr,Module *module,PassOptions *passOptions,
                        BranchSeekerCache *branchInfo)

{
  size_t sVar1;
  Name target;
  uint uVar2;
  Module *this;
  bool bVar3;
  Expression *pEVar4;
  Expression **ppEVar5;
  Drop *pDVar6;
  Expression *pEVar7;
  Expression **ppEVar8;
  uint *puVar9;
  Expression *pEVar10;
  Iterator IVar11;
  IteratorBase<wasm::SmallVector<wasm::Expression_*,_10UL>,_wasm::SmallVector<wasm::Expression_*,_10UL>::Iterator>
  IVar12;
  optional<wasm::Type> type_;
  optional<wasm::Type> type__00;
  optional<wasm::Type> type__01;
  Name target_00;
  optional<wasm::Type> local_218;
  Builder local_208;
  Builder builder;
  Expression **item_2;
  Iterator __end4;
  Iterator __begin4;
  SmallVector<wasm::Expression_*,_10UL> *__range4;
  Expression *last;
  size_t j_6;
  undefined1 local_1b8 [2] [12];
  undefined1 local_1a0 [12];
  uint local_190;
  uint local_18c;
  Index j_5;
  Index j_4;
  ExpressionList filtered;
  Index j_3;
  Expression *local_158;
  size_t j_2;
  SmallVector<wasm::Expression_*,_10UL> merged;
  bool keepingPart;
  Expression *item_1;
  int j_1;
  Name childName_1;
  Expression *item;
  size_t j;
  Name childName;
  Index keepEnd;
  Index keepStart;
  size_t childSize;
  ExpressionList *childList;
  Drop *drop;
  Loop *loop;
  Block *childBlock;
  Expression *child;
  size_t i;
  bool changed;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *pAStack_30;
  bool more;
  ExpressionList *list;
  BranchSeekerCache *branchInfo_local;
  PassOptions *passOptions_local;
  Module *module_local;
  Block *curr_local;
  
  pAStack_30 = &(curr->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>;
  i._7_1_ = 1;
  i._6_1_ = 0;
  list = (ExpressionList *)branchInfo;
  branchInfo_local = (BranchSeekerCache *)passOptions;
  passOptions_local = (PassOptions *)module;
  module_local = (Module *)curr;
LAB_01e769af:
  do {
    this = module_local;
    if ((i._7_1_ & 1) == 0) {
      if ((i._6_1_ & 1) != 0) {
        std::optional<wasm::Type>::optional<wasm::Type_&,_true>
                  (&local_218,
                   (Type *)&(module_local->exports).
                            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
        type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._9_7_ = 0;
        type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload =
             local_218.super__Optional_base<wasm::Type,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Type>._M_payload;
        type__01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_engaged =
             local_218.super__Optional_base<wasm::Type,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Type>._M_engaged;
        Block::finalize((Block *)this,type__01,Unknown);
      }
      return (bool)(i._6_1_ & 1);
    }
    i._7_1_ = 0;
    child = (Expression *)0x0;
LAB_01e769c5:
    pEVar7 = child;
    pEVar4 = (Expression *)
             ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size(pAStack_30);
    if (pEVar4 <= pEVar7) goto LAB_01e769af;
    ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        (pAStack_30,(size_t)child);
    childBlock = (Block *)*ppEVar5;
    loop = (Loop *)Expression::dynCast<wasm::Block>((Expression *)childBlock);
    drop = (Drop *)0x0;
    if ((Block *)loop == (Block *)0x0) {
      ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (pAStack_30,(size_t)child);
      pDVar6 = Expression::dynCast<wasm::Drop>(*ppEVar5);
      if (pDVar6 == (Drop *)0x0) {
        ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (pAStack_30,(size_t)child);
        drop = (Drop *)Expression::dynCast<wasm::Loop>(*ppEVar5);
        if ((Loop *)drop != (Loop *)0x0) {
          loop = (Loop *)Expression::dynCast<wasm::Block>(((Loop *)drop)->body);
        }
      }
      else {
        loop = (Loop *)Expression::dynCast<wasm::Block>(pDVar6->value);
        if (((Block *)loop == (Block *)0x0) ||
           (bVar3 = optimizeDroppedBlock
                              (pDVar6,(Block *)loop,(Module *)passOptions_local,
                               (PassOptions *)branchInfo_local,(BranchSeekerCache *)list), !bVar3))
        {
          loop = (Loop *)0x0;
        }
        else {
          ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (pAStack_30,(size_t)child);
          *ppEVar5 = (Expression *)loop;
          i._7_1_ = 1;
          i._6_1_ = 1;
          childBlock = (Block *)loop;
        }
      }
    }
    if (loop == (Loop *)0x0) {
LAB_01e771e7:
      child = (Expression *)&child->field_0x1;
      goto LAB_01e769c5;
    }
    ppEVar5 = &loop->body;
    pEVar7 = (Expression *)
             ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                       ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                        ppEVar5);
    if ((pEVar7 == (Expression *)0x0) || (bVar3 = hasDeadCode((Block *)loop), bVar3))
    goto LAB_01e771e7;
    item_1._4_4_ = (uint)pEVar7;
    childName.super_IString.str._M_str._0_4_ = 0;
    childName.super_IString.str._M_str._4_4_ = item_1._4_4_;
    bVar3 = IString::is(&(loop->name).super_IString);
    if (bVar3) {
      bVar3 = Type::isConcrete(&(loop->super_SpecificExpression<(wasm::Expression::Id)3>).
                                super_Expression.type);
      if (bVar3) goto LAB_01e771e7;
      sVar1 = (loop->name).super_IString.str._M_len;
      childName.super_IString.str._M_len = (size_t)(loop->name).super_IString.str._M_str;
      for (item = (Expression *)0x0; item < pEVar7; item = (Expression *)&item->field_0x1) {
        ppEVar8 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *
                             )ppEVar5,(size_t)item);
        target.super_IString.str._M_str = (char *)childName.super_IString.str._M_len;
        target.super_IString.str._M_len = sVar1;
        bVar3 = BranchUtils::BranchSeekerCache::hasBranch((BranchSeekerCache *)list,*ppEVar8,target)
        ;
        if (bVar3) {
          childName.super_IString.str._M_str._4_4_ = (uint)item;
          childName.super_IString.str._M_str._0_4_ = item_1._4_4_;
          break;
        }
      }
    }
    if (drop != (Drop *)0x0) {
      pEVar4 = drop->value;
      sVar1 = *(size_t *)
               &drop[1].super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression;
      pEVar10 = pEVar4;
      do {
        uVar2 = item_1._4_4_;
        item_1._4_4_ = uVar2 - 1;
        if ((int)item_1._4_4_ < 0) goto LAB_01e76cf4;
        ppEVar8 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *
                             )ppEVar5,(long)(int)item_1._4_4_);
        target_00.super_IString.str._M_str = (char *)pEVar10;
        target_00.super_IString.str._M_len = sVar1;
        bVar3 = BranchUtils::BranchSeeker::has((BranchSeeker *)*ppEVar8,pEVar4,target_00);
      } while (!bVar3);
      childName.super_IString.str._M_str._4_4_ = 0;
      merged.flexible.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = uVar2;
      puVar9 = std::max<unsigned_int>
                         ((uint *)((long)&merged.flexible.
                                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                          (uint *)&childName.super_IString.str._M_str);
      childName.super_IString.str._M_str._0_4_ = *puVar9;
LAB_01e76cf4:
      if ((Expression *)(ulong)(uint)childName.super_IString.str._M_str < pEVar7) {
        ppEVar8 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *
                             )ppEVar5);
        bVar3 = Type::isConcrete(&(*ppEVar8)->type);
        if (bVar3) goto LAB_01e771e7;
      }
    }
    if ((childName.super_IString.str._M_str._4_4_ == 0) &&
       ((Expression *)(ulong)(uint)childName.super_IString.str._M_str == pEVar7)) goto LAB_01e771e7;
    merged.flexible.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ =
         childName.super_IString.str._M_str._4_4_ < (uint)childName.super_IString.str._M_str;
    SmallVector<wasm::Expression_*,_10UL>::SmallVector
              ((SmallVector<wasm::Expression_*,_10UL> *)&j_2);
    for (local_158 = (Expression *)0x0; local_158 < child;
        local_158 = (Expression *)&local_158->field_0x1) {
      ppEVar8 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (pAStack_30,(size_t)local_158);
      SmallVector<wasm::Expression_*,_10UL>::push_back
                ((SmallVector<wasm::Expression_*,_10UL> *)&j_2,ppEVar8);
    }
    for (filtered.allocator._0_4_ = 0;
        (uint)filtered.allocator < childName.super_IString.str._M_str._4_4_;
        filtered.allocator._0_4_ = (uint)filtered.allocator + 1) {
      ppEVar8 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           ppEVar5,(ulong)(uint)filtered.allocator);
      SmallVector<wasm::Expression_*,_10UL>::push_back
                ((SmallVector<wasm::Expression_*,_10UL> *)&j_2,ppEVar8);
    }
    last = child;
    if ((merged.flexible.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) {
      SmallVector<wasm::Expression_*,_10UL>::push_back
                ((SmallVector<wasm::Expression_*,_10UL> *)&j_2,(Expression **)&childBlock);
      ArenaVector<wasm::Expression_*>::ArenaVector
                ((ArenaVector<wasm::Expression_*> *)&j_5,
                 (MixedArena *)&passOptions_local[2].passesToSkip._M_h._M_before_begin);
      for (local_18c = childName.super_IString.str._M_str._4_4_;
          local_18c < (uint)childName.super_IString.str._M_str; local_18c = local_18c + 1) {
        ppEVar8 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *
                             )ppEVar5,(ulong)local_18c);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)&j_5,
                   *ppEVar8);
      }
      for (local_190 = (uint)childName.super_IString.str._M_str;
          (Expression *)(ulong)local_190 < pEVar7; local_190 = local_190 + 1) {
        ppEVar8 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *
                             )ppEVar5,(ulong)local_190);
        SmallVector<wasm::Expression_*,_10UL>::push_back
                  ((SmallVector<wasm::Expression_*,_10UL> *)&j_2,ppEVar8);
      }
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::swap
                ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)ppEVar5,
                 (ArenaVector<wasm::Expression_*> *)&j_5);
      std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_1a0);
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._12_4_ = 0;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           (_Storage<wasm::Type,_true>)local_1a0._0_8_;
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_1a0[8];
      type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._9_3_ = local_1a0._9_3_;
      Block::finalize((Block *)loop,type_,Unknown);
      last = child;
      if (drop != (Drop *)0x0) {
        std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_1b8);
        type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._12_4_ = 0;
        type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload =
             (_Storage<wasm::Type,_true>)local_1b8[0]._0_8_;
        type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_1b8[0][8];
        type__00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._9_3_ = local_1b8[0]._9_3_;
        Loop::finalize((Loop *)drop,type__00);
        last = child;
      }
    }
    while( true ) {
      last = (Expression *)&last->field_0x1;
      pEVar7 = (Expression *)
               ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                         (pAStack_30);
      if (pEVar7 <= last) break;
      ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (pAStack_30,(size_t)last);
      SmallVector<wasm::Expression_*,_10UL>::push_back
                ((SmallVector<wasm::Expression_*,_10UL> *)&j_2,ppEVar5);
    }
    bVar3 = SmallVector<wasm::Expression_*,_10UL>::empty
                      ((SmallVector<wasm::Expression_*,_10UL> *)&j_2);
    if (!bVar3) {
      ppEVar5 = SmallVector<wasm::Expression_*,_10UL>::back
                          ((SmallVector<wasm::Expression_*,_10UL> *)&j_2);
      pEVar7 = *ppEVar5;
      IVar11 = SmallVector<wasm::Expression_*,_10UL>::begin
                         ((SmallVector<wasm::Expression_*,_10UL> *)&j_2);
      __end4.
      super_IteratorBase<wasm::SmallVector<wasm::Expression_*,_10UL>,_wasm::SmallVector<wasm::Expression_*,_10UL>::Iterator>
      .index = (size_t)IVar11.
                       super_IteratorBase<wasm::SmallVector<wasm::Expression_*,_10UL>,_wasm::SmallVector<wasm::Expression_*,_10UL>::Iterator>
                       .parent;
      IVar12 = (IteratorBase<wasm::SmallVector<wasm::Expression_*,_10UL>,_wasm::SmallVector<wasm::Expression_*,_10UL>::Iterator>
                )SmallVector<wasm::Expression_*,_10UL>::end
                           ((SmallVector<wasm::Expression_*,_10UL> *)&j_2);
      while( true ) {
        __end4.
        super_IteratorBase<wasm::SmallVector<wasm::Expression_*,_10UL>,_wasm::SmallVector<wasm::Expression_*,_10UL>::Iterator>
        .parent = (SmallVector<wasm::Expression_*,_10UL> *)IVar12.index;
        item_2 = (Expression **)IVar12.parent;
        bVar3 = SmallVector<wasm::Expression_*,_10UL>::
                IteratorBase<wasm::SmallVector<wasm::Expression_*,_10UL>,_wasm::SmallVector<wasm::Expression_*,_10UL>::Iterator>
                ::operator!=((IteratorBase<wasm::SmallVector<wasm::Expression_*,_10UL>,_wasm::SmallVector<wasm::Expression_*,_10UL>::Iterator>
                              *)&__end4.
                                 super_IteratorBase<wasm::SmallVector<wasm::Expression_*,_10UL>,_wasm::SmallVector<wasm::Expression_*,_10UL>::Iterator>
                                 .index,(Iterator *)&item_2);
        if (!bVar3) break;
        builder.wasm = (Module *)
                       SmallVector<wasm::Expression_*,_10UL>::Iterator::operator*
                                 ((Iterator *)
                                  &__end4.
                                   super_IteratorBase<wasm::SmallVector<wasm::Expression_*,_10UL>,_wasm::SmallVector<wasm::Expression_*,_10UL>::Iterator>
                                   .index);
        if (((Expression *)
             ((builder.wasm)->exports).
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start != pEVar7) &&
           (bVar3 = Type::isConcrete(&((value_type)
                                      ((builder.wasm)->exports).
                                      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->type), bVar3)) {
          Builder::Builder(&local_208,(Module *)passOptions_local);
          pDVar6 = Builder::makeDrop(&local_208,
                                     (Expression *)
                                     ((builder.wasm)->exports).
                                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
          ((builder.wasm)->exports).
          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)pDVar6;
        }
        SmallVector<wasm::Expression_*,_10UL>::
        IteratorBase<wasm::SmallVector<wasm::Expression_*,_10UL>,_wasm::SmallVector<wasm::Expression_*,_10UL>::Iterator>
        ::operator++((IteratorBase<wasm::SmallVector<wasm::Expression_*,_10UL>,_wasm::SmallVector<wasm::Expression_*,_10UL>::Iterator>
                      *)&__end4.
                         super_IteratorBase<wasm::SmallVector<wasm::Expression_*,_10UL>,_wasm::SmallVector<wasm::Expression_*,_10UL>::Iterator>
                         .index);
        IVar12.index = (size_t)__end4.
                               super_IteratorBase<wasm::SmallVector<wasm::Expression_*,_10UL>,_wasm::SmallVector<wasm::Expression_*,_10UL>::Iterator>
                               .parent;
        IVar12.parent = (SmallVector<wasm::Expression_*,_10UL> *)item_2;
      }
    }
    ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
    set<wasm::SmallVector<wasm::Expression*,10ul>>
              ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)pAStack_30,
               (SmallVector<wasm::Expression_*,_10UL> *)&j_2);
    i._7_1_ = 1;
    i._6_1_ = 1;
    SmallVector<wasm::Expression_*,_10UL>::~SmallVector
              ((SmallVector<wasm::Expression_*,_10UL> *)&j_2);
  } while( true );
}

Assistant:

static bool optimizeBlock(Block* curr,
                          Module* module,
                          PassOptions& passOptions,
                          BranchUtils::BranchSeekerCache& branchInfo) {
  auto& list = curr->list;
  // Main merging loop.
  bool more = true;
  bool changed = false;
  while (more) {
    more = false;
    for (size_t i = 0; i < list.size(); i++) {
      auto* child = list[i];
      // The child block, if there is one.
      Block* childBlock = child->dynCast<Block>();
      // If we are merging an inner block of a loop, then we must not
      // merge things before and including the name of the loop, moving
      // those out would break things.
      Loop* loop = nullptr;
      // To to handle a non-block child.
      if (!childBlock) {
        // If we have a child that is (drop (block ..)) then we can move the
        // drop into the block, and remove br values. This allows more merging.
        if (auto* drop = list[i]->dynCast<Drop>()) {
          childBlock = drop->value->dynCast<Block>();
          if (childBlock &&
              optimizeDroppedBlock(
                drop, childBlock, *module, passOptions, branchInfo)) {
            child = list[i] = childBlock;
            more = true;
            changed = true;
          } else {
            childBlock = nullptr;
          }
        } else if ((loop = list[i]->dynCast<Loop>())) {
          // We can merge a loop's "tail" - if the body is a block and has
          // instructions at the end that do not branch back.
          childBlock = loop->body->dynCast<Block>();
          // TODO: handle (loop (loop - the bodies of loops may not be blocks
        }
      }
      // If no block, we can't do anything.
      if (!childBlock) {
        continue;
      }
      auto& childList = childBlock->list;
      auto childSize = childList.size();
      if (childSize == 0) {
        continue;
      }
      // If the child has items after an unreachable, ignore it - dce should
      // have been run, and we prefer to not handle the complexity here.
      if (hasDeadCode(childBlock)) {
        continue;
      }
      // In some cases we can remove only the head or the tail of the block,
      // and must keep some things in the child block.
      Index keepStart = childSize;
      Index keepEnd = 0;
      // For a block with a name, we may only be able to remove a head, up
      // to the first item that branches to the block.
      if (childBlock->name.is()) {
        // If it has a concrete value, then breaks may be sending it a value,
        // and we'd need to handle that. TODO
        if (childBlock->type.isConcrete()) {
          continue;
        }
        auto childName = childBlock->name;
        for (size_t j = 0; j < childSize; j++) {
          auto* item = childList[j];
          if (branchInfo.hasBranch(item, childName)) {
            // We can't remove this from the child.
            keepStart = j;
            keepEnd = childSize;
            break;
          }
        }
      }
      // For a loop, we may only be able to remove a tail
      if (loop) {
        auto childName = loop->name;
        for (auto j = int(childSize - 1); j >= 0; j--) {
          auto* item = childList[j];
          if (BranchUtils::BranchSeeker::has(item, childName)) {
            // We can't remove this from the child.
            keepStart = 0;
            keepEnd = std::max(Index(j + 1), keepEnd);
            break;
          }
        }
        // If we can only do part of the block, and if the block has a flowing
        // value, we would need special handling for that - not worth it,
        // probably TODO
        // FIXME is this not handled by the drop later down?
        if (keepEnd < childSize && childList.back()->type.isConcrete()) {
          continue;
        }
      }
      // Maybe there's nothing to do, if we must keep it all in the
      // child anyhow.
      if (keepStart == 0 && keepEnd == childSize) {
        continue;
      }
      // There is something to do!
      bool keepingPart = keepStart < keepEnd;
      // Create a new merged list, and fill in the code before the child block
      // we are merging in. It is efficient to use a small vector here because
      // most blocks are fairly small, and this way we copy once into the arena
      // we use for Block lists a single time at the end (arena allocations
      // can't be freed, so any temporary allocations while we add to the list
      // would end up wasted).
      SmallVector<Expression*, 10> merged;
      for (size_t j = 0; j < i; j++) {
        merged.push_back(list[j]);
      }
      // Add the head of the block - the things at the start we do
      // not need to keep.
      for (Index j = 0; j < keepStart; j++) {
        merged.push_back(childList[j]);
      }
      // If we can't merge it all, keep and filter the child.
      if (keepingPart) {
        merged.push_back(child);
        // Filter the child.
        ExpressionList filtered(module->allocator);
        for (Index j = keepStart; j < keepEnd; j++) {
          filtered.push_back(childList[j]);
        }
        // Add the tail of the block - the things at the end we do
        // not need to keep.
        for (Index j = keepEnd; j < childSize; j++) {
          merged.push_back(childList[j]);
        }
        // Update the child.
        childList.swap(filtered);
        // We may have removed unreachable items.
        childBlock->finalize();
        if (loop) {
          loop->finalize();
        }
        // Note that we modify the child block here, which invalidates info
        // in branchInfo. However, as we have scanned the parent, we have
        // already forgotten the child's info, so there is nothing to do here
        // for the child.
        // (We also don't need to do anything for the parent - we move code
        // from a child into the parent, but that doesn't change the total
        // branches in the parent.)
      }
      // Add the rest of the parent block after the child.
      for (size_t j = i + 1; j < list.size(); j++) {
        merged.push_back(list[j]);
      }
      // if we merged a concrete element in the middle, drop it
      if (!merged.empty()) {
        auto* last = merged.back();
        for (auto*& item : merged) {
          if (item != last && item->type.isConcrete()) {
            Builder builder(*module);
            item = builder.makeDrop(item);
          }
        }
      }
      list.set(merged);
      more = true;
      changed = true;
      break;
    }
  }
  if (changed) {
    curr->finalize(curr->type);
  }
  return changed;
}